

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt * __thiscall llvm::APInt::operator-=(APInt *this,uint64_t RHS)

{
  WordType *dst;
  bool bVar1;
  uint parts;
  APInt *pAVar2;
  uint64_t RHS_local;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).pVal = (uint64_t *)((long)(this->U).pVal - RHS);
  }
  else {
    dst = (this->U).pVal;
    parts = getNumWords(this);
    tcSubtractPart(dst,RHS,parts);
  }
  pAVar2 = clearUnusedBits(this);
  return pAVar2;
}

Assistant:

APInt& APInt::operator-=(uint64_t RHS) {
  if (isSingleWord())
    U.VAL -= RHS;
  else
    tcSubtractPart(U.pVal, RHS, getNumWords());
  return clearUnusedBits();
}